

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlCharEncOutFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int written;
  int local_94;
  int toconv;
  int len;
  xmlChar charref [20];
  char buf [50];
  
  if (out == (xmlBufferPtr)0x0 || handler == (xmlCharEncodingHandler *)0x0) {
    return -1;
  }
  iVar5 = 0;
  do {
    while( true ) {
      uVar6 = (ulong)out->use;
      local_94 = out->size - out->use;
      local_94 = local_94 - (uint)(0 < local_94);
      if (in == (xmlBufferPtr)0x0) {
        toconv = 0;
        xmlEncOutputChunk(handler,out->content + uVar6,&local_94,(uchar *)0x0,&toconv);
        uVar4 = out->use + local_94;
        out->use = uVar4;
        out->content[uVar4] = '\0';
        return 0;
      }
      toconv = in->use;
      if (toconv == 0) {
        return 0;
      }
      if (local_94 <= toconv * 4) {
        xmlBufferGrow(out,toconv * 4);
        uVar6 = (ulong)out->use;
        local_94 = ~out->use + out->size;
      }
      iVar2 = xmlEncOutputChunk(handler,out->content + uVar6,&local_94,in->content,&toconv);
      xmlBufferShrink(in,toconv);
      uVar4 = out->use + local_94;
      out->use = uVar4;
      iVar5 = iVar5 + local_94;
      out->content[uVar4] = '\0';
      if (iVar2 != -2) break;
      len = in->use;
      uVar4 = xmlGetUTF8Char(in->content,&len);
      if ((int)uVar4 < 1) {
        iVar2 = -2;
        goto LAB_00144850;
      }
      iVar3 = snprintf((char *)charref,0x14,"&#%d;",(ulong)uVar4);
      xmlBufferShrink(in,len);
      xmlBufferGrow(out,iVar3 * 4);
      local_94 = ~out->use + out->size;
      toconv = iVar3;
      iVar2 = xmlEncOutputChunk(handler,out->content + out->use,&local_94,charref,&toconv);
      if ((iVar2 < 0) || (toconv != iVar3)) {
        pbVar1 = in->content;
        snprintf(buf,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*pbVar1,(ulong)pbVar1[1],
                 (ulong)pbVar1[2],(uint)pbVar1[3]);
        buf[0x31] = '\0';
        xmlEncodingErr(XML_I18N_CONV_FAILED,"output conversion failed due to conv error, bytes %s\n"
                       ,buf);
        if (in->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
          *in->content = ' ';
        }
        goto LAB_00144850;
      }
      uVar4 = out->use + local_94;
      out->use = uVar4;
      iVar5 = iVar5 + local_94;
      out->content[uVar4] = '\0';
    }
    if (iVar2 != -1) {
      if (iVar2 == -4) {
        xmlEncodingErr(XML_I18N_NO_OUTPUT,"xmlCharEncOutFunc: no output function !\n",(char *)0x0);
        iVar2 = -1;
      }
      goto LAB_00144850;
    }
  } while (0 < local_94);
  iVar2 = -3;
LAB_00144850:
  if (iVar5 != 0) {
    iVar2 = iVar5;
  }
  return iVar2;
}

Assistant:

int
xmlCharEncOutFunc(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                  xmlBufferPtr in) {
    int ret;
    int written;
    int writtentot = 0;
    int toconv;
    int output = 0;

    if (handler == NULL) return(-1);
    if (out == NULL) return(-1);

retry:

    written = out->size - out->use;

    if (written > 0)
	written--; /* Gennady: count '/0' */

    /*
     * First specific handling of in = NULL, i.e. the initialization call
     */
    if (in == NULL) {
        toconv = 0;
        /* TODO: Check return value. */
        xmlEncOutputChunk(handler, &out->content[out->use], &written,
                          NULL, &toconv);
        out->use += written;
        out->content[out->use] = 0;
#ifdef DEBUG_ENCODING
	xmlGenericError(xmlGenericErrorContext,
		"initialized encoder\n");
#endif
        return(0);
    }

    /*
     * Conversion itself.
     */
    toconv = in->use;
    if (toconv == 0)
	return(0);
    if (toconv * 4 >= written) {
        xmlBufferGrow(out, toconv * 4);
	written = out->size - out->use - 1;
    }
    ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                            in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    writtentot += written;
    out->content[out->use] = 0;
    if (ret == -1) {
        if (written > 0) {
            /* Can be a limitation of iconv or uconv */
            goto retry;
        }
        ret = -3;
    }

    if (ret >= 0) output += ret;

    /*
     * Attempt to handle error cases
     */
    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of output\n",
	            toconv, written);
#endif
	    break;
        case -1:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "output conversion failed by lack of space\n");
#endif
	    break;
        case -3:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of output %d left\n",
	            toconv, written, in->use);
#endif
	    break;
        case -4:
	    xmlEncodingErr(XML_I18N_NO_OUTPUT,
		           "xmlCharEncOutFunc: no output function !\n", NULL);
	    ret = -1;
            break;
        case -2: {
	    xmlChar charref[20];
	    int len = in->use;
	    const xmlChar *utf = (const xmlChar *) in->content;
	    int cur, charrefLen;

	    cur = xmlGetUTF8Char(utf, &len);
	    if (cur <= 0)
                break;

#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                    "handling output conversion error\n");
            xmlGenericError(xmlGenericErrorContext,
                    "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
                    in->content[0], in->content[1],
                    in->content[2], in->content[3]);
#endif
            /*
             * Removes the UTF8 sequence, and replace it by a charref
             * and continue the transcoding phase, hoping the error
             * did not mangle the encoder state.
             */
            charrefLen = snprintf((char *) &charref[0], sizeof(charref),
                             "&#%d;", cur);
            xmlBufferShrink(in, len);
            xmlBufferGrow(out, charrefLen * 4);
	    written = out->size - out->use - 1;
            toconv = charrefLen;
            ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                                    charref, &toconv);

	    if ((ret < 0) || (toconv != charrefLen)) {
		char buf[50];

		snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
			 in->content[0], in->content[1],
			 in->content[2], in->content[3]);
		buf[49] = 0;
		xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "output conversion failed due to conv error, bytes %s\n",
			       buf);
		if (in->alloc != XML_BUFFER_ALLOC_IMMUTABLE)
		    in->content[0] = ' ';
	        break;
	    }

            out->use += written;
            writtentot += written;
            out->content[out->use] = 0;
            goto retry;
	}
    }
    return(writtentot ? writtentot : ret);
}